

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

int google::protobuf::UnescapeCEscapeString
              (string *src,string *dest,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *errors)

{
  int iVar1;
  long lVar2;
  pointer pcVar3;
  char *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  char *unaff_retaddr;
  char *in_stack_00000008;
  int len;
  unique_ptr<char[],_std::default_delete<char[]>_> unescaped;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined8 in_stack_ffffffffffffff68;
  LogLevel_conflict level;
  LogMessage *in_stack_ffffffffffffff70;
  
  level = (LogLevel_conflict)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  lVar2 = std::__cxx11::string::size();
  operator_new__(lVar2 + 1);
  std::unique_ptr<char[],std::default_delete<char[]>>::
  unique_ptr<char*,std::default_delete<char[]>,void,bool>
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  std::__cxx11::string::c_str();
  std::unique_ptr<char[],_std::default_delete<char[]>_>::get
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  iVar1 = UnescapeCEscapeSequences(in_stack_00000008,unaff_retaddr,in_RDI);
  if (in_RSI == (char *)0x0) {
    internal::LogMessage::LogMessage
              (in_stack_ffffffffffffff70,level,
               (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff5c);
    internal::LogMessage::operator<<
              ((LogMessage *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    internal::LogFinisher::operator=
              ((LogFinisher *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    internal::LogMessage::~LogMessage((LogMessage *)0x405763);
  }
  pcVar3 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                     ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                      CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  std::__cxx11::string::assign(in_RSI,(ulong)pcVar3);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)
             CONCAT44(iVar1,in_stack_ffffffffffffff60));
  return iVar1;
}

Assistant:

int UnescapeCEscapeString(const string& src, string* dest,
                          std::vector<string> *errors) {
  std::unique_ptr<char[]> unescaped(new char[src.size() + 1]);
  int len = UnescapeCEscapeSequences(src.c_str(), unescaped.get(), errors);
  GOOGLE_CHECK(dest);
  dest->assign(unescaped.get(), len);
  return len;
}